

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

bool __thiscall IRBuilder::IsLoopBodyReturnIPInstr(IRBuilder *this,Instr *instr)

{
  bool bVar1;
  Opnd *this_00;
  RegOpnd *pRVar2;
  bool local_21;
  Opnd *dst;
  Instr *instr_local;
  IRBuilder *this_local;
  
  this_00 = IR::Instr::GetDst(instr);
  local_21 = false;
  if (this_00 != (Opnd *)0x0) {
    bVar1 = IR::Opnd::IsRegOpnd(this_00);
    local_21 = false;
    if (bVar1) {
      pRVar2 = IR::Opnd::AsRegOpnd(this_00);
      local_21 = pRVar2->m_sym == this->m_loopBodyRetIPSym;
    }
  }
  return local_21;
}

Assistant:

bool
IRBuilder::IsLoopBodyReturnIPInstr(IR::Instr * instr) const
{
     IR::Opnd * dst = instr->GetDst();
     return (dst && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym == m_loopBodyRetIPSym);
}